

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameLoop::distributeArmies(GameLoop *this)

{
  Country *pCVar1;
  ulong uVar2;
  bool bVar3;
  int numberOfPlayers_00;
  int iVar4;
  result_type_conflict1 rVar5;
  result_type_conflict rVar6;
  int iVar7;
  size_type sVar8;
  reference ppPVar9;
  ostream *poVar10;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar11;
  PlayerStrategy *this_00;
  reference ppCVar12;
  __type local_2821;
  Country *currCountry_1;
  int countryToPlaceOn_1;
  int i_2;
  uniform_int_distribution<int> distr;
  mt19937 eng;
  random_device rd;
  Country *currCountry;
  int countryToPlaceOn;
  int i_1;
  ulong local_88;
  unsigned_long i;
  string local_70;
  reference local_50;
  Country **country;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  value_type pPStack_28;
  int counter;
  Player *currentPlayer;
  int currentPlayerPosition;
  int numberOfArmies;
  int numberOfPlayers;
  GameLoop *this_local;
  
  sVar8 = std::vector<Player_*,_std::allocator<Player_*>_>::size(this->allPlayers);
  numberOfPlayers_00 = (int)sVar8;
  iVar4 = getNumberOfArmies(numberOfPlayers_00);
  currentPlayer._4_4_ = 0;
  ppPVar9 = std::vector<Player_*,_std::allocator<Player_*>_>::at(this->allPlayers,0);
  pPStack_28 = *ppPVar9;
  __range2._4_4_ = 0;
  poVar10 = std::operator<<((ostream *)&std::cout,"\nEach player has ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar4);
  std::operator<<(poVar10," armies to place on their countries. \n");
  for (; __range2._4_4_ < numberOfPlayers_00; __range2._4_4_ = __range2._4_4_ + 1) {
    pvVar11 = Player::getOwnedCountries(pPStack_28);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar11);
    country = (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar11)
    ;
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&country), bVar3) {
      local_50 = __gnu_cxx::
                 __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                 ::operator*(&__end2);
      Map::Country::setNumberOfTroops(*local_50,1);
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    this_00 = Player::getStrategy(pPStack_28);
    PlayerStrategy::getStrategyName_abi_cxx11_(&local_70,this_00);
    bVar3 = std::operator==(&local_70,"HUMAN");
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar3) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Placing 1 army per country.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"Player ");
      iVar7 = Player::getPlayerId(pPStack_28);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
      std::operator<<(poVar10," , please place your armies. Here is your list of countries :\n");
      local_88 = 1;
      while( true ) {
        uVar2 = local_88;
        pvVar11 = Player::getOwnedCountries(pPStack_28);
        sVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar11);
        if (sVar8 < uVar2) break;
        poVar10 = (ostream *)std::ostream::operator<<(&std::cout,local_88);
        poVar10 = std::operator<<(poVar10," - ");
        pvVar11 = Player::getOwnedCountries(pPStack_28);
        ppCVar12 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                             (pvVar11,local_88 - 1);
        Map::Country::getCountryName_abi_cxx11_((string *)&countryToPlaceOn,*ppCVar12);
        poVar10 = std::operator<<(poVar10,(string *)&countryToPlaceOn);
        std::operator<<(poVar10,"\n");
        std::__cxx11::string::~string((string *)&countryToPlaceOn);
        local_88 = local_88 + 1;
      }
      pvVar11 = Player::getOwnedCountries(pPStack_28);
      sVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar11);
      currCountry._4_4_ = (int)sVar8;
      while (currCountry._4_4_ = currCountry._4_4_ + 1, currCountry._4_4_ <= iVar4) {
        do {
          poVar10 = std::operator<<((ostream *)&std::cout,"\nWhere do you place army number ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,currCountry._4_4_);
          std::operator<<(poVar10,": ");
          std::istream::operator>>((istream *)&std::cin,(int *)&currCountry);
          std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
          std::istream::ignore((long)&std::cin,0x200);
          iVar7 = (int)currCountry;
          local_2821 = true;
          if (0 < (int)currCountry) {
            pvVar11 = Player::getOwnedCountries(pPStack_28);
            sVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar11);
            local_2821 = true;
            if (iVar7 <= (int)sVar8) {
              local_2821 = std::isnan<int>((int)currCountry);
            }
          }
        } while (local_2821 != false);
        pvVar11 = Player::getOwnedCountries(pPStack_28);
        ppCVar12 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                             (pvVar11,(long)((int)currCountry + -1));
        pCVar1 = *ppCVar12;
        iVar7 = Map::Country::getNumberOfTroops(pCVar1);
        Map::Country::setNumberOfTroops(pCVar1,iVar7 + 1);
      }
    }
    else {
      std::random_device::random_device((random_device *)&eng._M_p);
      rVar5 = std::random_device::operator()((random_device *)&eng._M_p);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)&distr,(ulong)rVar5);
      pvVar11 = Player::getOwnedCountries(pPStack_28);
      sVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar11);
      std::uniform_int_distribution<int>::uniform_int_distribution
                ((uniform_int_distribution<int> *)&countryToPlaceOn_1,1,(int)sVar8);
      pvVar11 = Player::getOwnedCountries(pPStack_28);
      sVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar11);
      currCountry_1._4_4_ = (int)sVar8;
      while (currCountry_1._4_4_ = currCountry_1._4_4_ + 1, currCountry_1._4_4_ <= iVar4) {
        rVar6 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&countryToPlaceOn_1,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&distr);
        pvVar11 = Player::getOwnedCountries(pPStack_28);
        ppCVar12 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                             (pvVar11,(long)(rVar6 + -1));
        pCVar1 = *ppCVar12;
        iVar7 = Map::Country::getNumberOfTroops(pCVar1);
        Map::Country::setNumberOfTroops(pCVar1,iVar7 + 1);
      }
      std::random_device::~random_device((random_device *)&eng._M_p);
    }
    currentPlayer._4_4_ = (currentPlayer._4_4_ + 1) % numberOfPlayers_00;
    ppPVar9 = std::vector<Player_*,_std::allocator<Player_*>_>::at
                        (this->allPlayers,(long)currentPlayer._4_4_);
    pPStack_28 = *ppPVar9;
  }
  return;
}

Assistant:

void GameLoop::distributeArmies() {
    int numberOfPlayers = allPlayers->size();
    int numberOfArmies = getNumberOfArmies(numberOfPlayers);
    int currentPlayerPosition = 0;
    Player* currentPlayer = allPlayers->at(currentPlayerPosition);
    int counter = 0;
    cout << "\nEach player has " << numberOfArmies << " armies to place on their countries. \n";
    while (counter < numberOfPlayers) {
        //place one troop per country
        for (auto& country : *currentPlayer->getOwnedCountries()) {
            country->setNumberOfTroops(1);
        }

        if (currentPlayer->getStrategy()->getStrategyName() == "HUMAN") {
            cout << "Placing 1 army per country." << std::endl;
            cout << "Player " << currentPlayer->getPlayerId()
                 << " , please place your armies. Here is your list of countries :\n";
            for (unsigned long i = 1; i <= currentPlayer->getOwnedCountries()->size(); i++) {
                cout << i << " - " << currentPlayer->getOwnedCountries()->at(i - 1)->getCountryName() << "\n";
            }
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn;
                do {
                    cout << "\nWhere do you place army number " << i << ": ";
                    cin >> countryToPlaceOn;
                    cin.clear();
                    cin.ignore(512, '\n');
                } while (countryToPlaceOn < 1 || countryToPlaceOn > int(currentPlayer->getOwnedCountries()->size()) ||
                         isnan(countryToPlaceOn));
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        } else {
            std::random_device rd;
            std::mt19937 eng(rd());
            std::uniform_int_distribution<> distr(1, int(currentPlayer->getOwnedCountries()->size()));
            //place troops randomly
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn = distr(eng);
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        }
        currentPlayerPosition++;
        currentPlayerPosition = currentPlayerPosition % numberOfPlayers;
        currentPlayer = allPlayers->at(currentPlayerPosition);
        counter++;
    }
}